

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curve.h
# Opt level: O0

string * anurbs::Curve<3l,anurbs::Ref<anurbs::NurbsCurveGeometry<3l>>>::python_name_abi_cxx11_(void)

{
  Index __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  __val = CurveBase<3L>::dimension();
  std::__cxx11::to_string(&local_50,__val);
  std::operator+(&local_30,"Curve",&local_50);
  std::operator+(in_RDI,&local_30,"D");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return in_RDI;
}

Assistant:

static std::string python_name()
    {
        return "Curve" + std::to_string(dimension()) + "D";
    }